

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.h
# Opt level: O2

void __thiscall soplex::SPxParMultPR<double>::SPxParMultPR(SPxParMultPR<double> *this)

{
  (this->super_SPxPricer<double>).m_name = "ParMult";
  (this->super_SPxPricer<double>).thesolver = (SPxSolverBase<double> *)0x0;
  (this->super_SPxPricer<double>).thetolerance = 0.0;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxPricer<double>).compare.elements = (IdxElement *)0x0;
  (this->super_SPxPricer<double>)._vptr_SPxPricer = (_func_int **)&PTR_getName_003354f0;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array(&this->pricSet,0);
  this->multiParts = 0;
  this->used = 0;
  this->min = 0;
  this->last = 0;
  this->partialSize = 0x11;
  return;
}

Assistant:

SPxParMultPR()
      : SPxPricer<R>("ParMult")
      , multiParts(0)
      , used(0)
      , min(0)
      , last(0)
      , partialSize(17)
   {}